

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::Cues::Cues
          (Cues *this,Segment *pSegment,longlong start_,longlong size_,longlong element_start,
          longlong element_size)

{
  longlong element_size_local;
  longlong element_start_local;
  longlong size__local;
  longlong start__local;
  Segment *pSegment_local;
  Cues *this_local;
  
  this->m_pSegment = pSegment;
  this->m_start = start_;
  this->m_size = size_;
  this->m_element_start = element_start;
  this->m_element_size = element_size;
  this->m_cue_points = (CuePoint **)0x0;
  this->m_count = 0;
  this->m_preload_count = 0;
  this->m_pos = start_;
  return;
}

Assistant:

Cues::Cues(Segment* pSegment, long long start_, long long size_,
           long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_start(start_),
      m_size(size_),
      m_element_start(element_start),
      m_element_size(element_size),
      m_cue_points(NULL),
      m_count(0),
      m_preload_count(0),
      m_pos(start_) {}